

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O0

void __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::executeTestCase
          (GPUShader5ImplicitConversionsTest *this,testCase *test_case)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLchar *fragment_shader_code;
  GLchar *vertex_shader_code;
  undefined1 local_98 [8];
  programInfo program;
  string local_70;
  string *local_50;
  string *vs;
  string *local_28;
  string *fs;
  Functions *gl;
  testCase *test_case_local;
  GPUShader5ImplicitConversionsTest *this_local;
  
  gl = (Functions *)test_case;
  test_case_local = (testCase *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  fs = (string *)CONCAT44(extraout_var,iVar1);
  getFragmentShader_abi_cxx11_((string *)&vs,this);
  local_28 = (string *)&vs;
  getVertexShader_abi_cxx11_
            (&local_70,this,(GLchar *)gl->activeShaderProgram,(GLchar *)gl->attachShader);
  local_50 = &local_70;
  Utils::programInfo::programInfo((programInfo *)local_98,(this->super_TestCase).m_context);
  fragment_shader_code = (GLchar *)std::__cxx11::string::c_str();
  vertex_shader_code = (GLchar *)std::__cxx11::string::c_str();
  Utils::programInfo::build((programInfo *)local_98,fragment_shader_code,vertex_shader_code);
  (**(code **)(fs + 0xb4))(program.m_context._4_4_);
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x228);
  Utils::programInfo::setUniform
            ((programInfo *)local_98,*(_variable_type *)&gl->beginConditionalRender,"u1",
             gl->beginQuery);
  Utils::programInfo::setUniform
            ((programInfo *)local_98,*(_variable_type *)&gl->beginConditionalRender,"u2",
             gl->beginQueryIndexed);
  (**(code **)(fs + 0xe))(0x3f000000,0x3f000000,0x3f000000);
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"clearColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x22f);
  (*(code *)fs[0xc]._M_string_length)(0x4000);
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x232);
  (**(code **)((long)&fs[0x29].field_2 + 8))(5,0,4);
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x236);
  Utils::programInfo::~programInfo((programInfo *)local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&vs);
  verifyImage(this,0xffffffff,(bool)(*(byte *)&gl->activeTexture & 1));
  return;
}

Assistant:

void GPUShader5ImplicitConversionsTest::executeTestCase(const testCase& test_case)
{
	static const glw::GLuint white_color = 0xffffffff;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Run test case */
	{
		/* Get shaders */
		const std::string& fs = getFragmentShader();
		const std::string& vs = getVertexShader(test_case.m_destination_type, test_case.m_source_type);

		/* Prepare program */
		Utils::programInfo program(m_context);

		program.build(fs.c_str(), vs.c_str());

		gl.useProgram(program.m_program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		program.setUniform(test_case.m_source_variable_type, "u1", test_case.m_u1_data);
		program.setUniform(test_case.m_source_variable_type, "u2", test_case.m_u2_data);

		/* Clear FBO */
		gl.clearColor(0.5f, 0.5f, 0.5f, 0.5f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clearColor");

		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		/* Draw a triangle strip */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");
	}

	/* Verification */
	verifyImage(white_color, test_case.m_is_white_expected);
}